

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O3

istream * operator>>(istream *s,Am_Gesture_Trainer *tr)

{
  uint *puVar1;
  Am_Gesture_Trainer_Data *pAVar2;
  bool bVar3;
  istream *piVar4;
  Am_Gesture_Classifier_Data *cldata;
  istream *this;
  long *plVar5;
  Am_Wrapper *value;
  Gesture_Class *this_00;
  char check;
  Am_Gesture_Classifier cl;
  int y;
  int x;
  Am_Feature_Vector fv;
  char buf [100];
  char local_c9;
  Am_Gesture_Trainer_Data *local_c8;
  Am_Gesture_Classifier local_c0;
  int local_b8;
  int local_b4;
  Am_Gesture_Trainer *local_b0;
  Am_String local_a8;
  Am_Feature_Vector local_a0;
  char local_98 [104];
  
  local_b0 = tr;
  Am_Gesture_Classifier::Am_Gesture_Classifier(&local_c0);
  piVar4 = operator>>(s,&local_c0);
  if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
    local_c8 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    cldata = (Am_Gesture_Classifier_Data *)
             Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(&local_c0);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(local_c8,cldata);
    bVar3 = Am_Gesture_Classifier::Trained(&local_c0);
    if (bVar3) {
      Am_Gesture_Classifier::operator=(&local_c8->cached_classifier,&local_c0);
    }
    else {
      Am_Gesture_Classifier::operator=
                (&local_c8->cached_classifier,(Am_Gesture_Classifier_Data *)0x0);
    }
    piVar4 = std::operator>>(s,&local_c9);
    if (local_c9 == 'x' && ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      do {
        Am_Feature_Vector::Am_Feature_Vector(&local_a0);
        std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
        std::istream::get((char *)s,(long)local_98,'d');
        if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) != 0) {
LAB_001a6492:
          Am_Feature_Vector::~Am_Feature_Vector(&local_a0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unrecognized gesture classifier format",0x26);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
          std::ostream::put('p');
          std::ostream::flush();
          goto LAB_001a64e7;
        }
        Am_String::Am_String(&local_a8,local_98,true);
        this_00 = local_c8->head;
        while( true ) {
          if (this_00 == (Gesture_Class *)0x0) {
            Am_String::~Am_String(&local_a8);
            goto LAB_001a6492;
          }
          bVar3 = Am_String::operator==(&this_00->name,&local_a8);
          if (bVar3) break;
          this_00 = this_00->next;
        }
        Am_String::~Am_String(&local_a8);
        while( true ) {
          this = (istream *)std::istream::operator>>((istream *)s,&local_b4);
          plVar5 = (long *)std::istream::operator>>(this,&local_b8);
          if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
          Am_Feature_Vector::Add_Point(&local_a0,local_b4,local_b8);
        }
        std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
        value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(&local_a0);
        Am_Value_List::Add(&this_00->examples,value,Am_TAIL,true);
        Am_Feature_Vector::~Am_Feature_Vector(&local_a0);
        piVar4 = std::operator>>(s,&local_c9);
      } while ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) &&
              (local_c9 == 'x'));
    }
    if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
      std::istream::putback((char)s);
    }
    pAVar2 = local_b0->data;
    if (pAVar2 != (Am_Gesture_Trainer_Data *)0x0) {
      puVar1 = &(pAVar2->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
      }
    }
    local_b0->data = local_c8;
LAB_001a64e7:
    std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
  }
  Am_Gesture_Classifier::~Am_Gesture_Classifier(&local_c0);
  return s;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Trainer &tr)
{
  // First read in a classifier (or an untrained classifier containing only
  // class names)
  Am_Gesture_Classifier cl;

  if (!(s >> cl))
    return s;

  Am_Gesture_Trainer_Data *trdata;
  Am_Gesture_Trainer_Data::Gesture_Class *cls = nullptr;
  char check;
  char buf[100];
  int x, y;

  // construct a new trainer by copying the classes in cl
  trdata = new Am_Gesture_Trainer_Data(
      (Am_Gesture_Classifier_Data *)(Am_Wrapper *)cl);

  if (cl.Trained())
    trdata->cached_classifier = cl;
  else
    trdata->cached_classifier = nullptr;

  // Now look for examples.  Examples have the check character 'x'.

  if ((s >> check) && check == 'x') {
    //AM_TRACE("Reading training examples\n");

    do {
      Am_Feature_Vector fv;

      // get the class name of this example
      s.get(buf, sizeof(buf));
      if (!s || (cls = trdata->Find_Class(buf)) == nullptr)
        goto LFail;

      // accumulate the points from this example
      while (s >> x >> y)
        fv.Add_Point(x, y);
      s.clear(std::ios::goodbit);

      cls->examples.Add(fv);

    } while ((s >> check) && check == 'x');
  }

  if (s)
    s.putback(check);

  // return the new trainer
  if (tr.data)
    tr.data->Release();
  tr.data = trdata;

  s.clear(std::ios::goodbit);
  return s;

LFail:
  static const char *bad_format = "unrecognized gesture classifier format";
  std::cerr << bad_format << std::endl;
  s.clear(std::ios::badbit);
  return s;
}